

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

Error asmjit::Formatter::formatNodeList
                (String *sb,uint32_t formatFlags,BaseBuilder *builder,BaseNode *begin,BaseNode *end)

{
  Error EVar1;
  
  while( true ) {
    if (begin == end) {
      return 0;
    }
    EVar1 = formatNode(sb,formatFlags,builder,begin);
    if (EVar1 != 0) break;
    EVar1 = String::append(sb,'\n');
    if (EVar1 != 0) {
      return EVar1;
    }
    begin = (begin->field_0).field_0._next;
  }
  return EVar1;
}

Assistant:

Error formatNodeList(
  String& sb,
  uint32_t formatFlags,
  const BaseBuilder* builder,
  const BaseNode* begin,
  const BaseNode* end) noexcept {

  const BaseNode* node = begin;
  while (node != end) {
    ASMJIT_PROPAGATE(formatNode(sb, formatFlags, builder, node));
    ASMJIT_PROPAGATE(sb.append('\n'));
    node = node->next();
  }
  return kErrorOk;
}